

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memset.c
# Opt level: O3

void * memset(void *__s,int __c,size_t __n)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  long lVar29;
  ulong uVar30;
  undefined1 uVar31;
  uchar *p;
  undefined1 auVar32 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  int iVar52;
  int iVar55;
  int iVar56;
  undefined1 auVar53 [16];
  int iVar57;
  undefined1 auVar54 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  int iVar71;
  int iVar75;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  
  auVar28 = _DAT_0010dde0;
  auVar27 = _DAT_0010ddd0;
  auVar26 = _DAT_0010ddc0;
  auVar25 = _DAT_0010ddb0;
  auVar24 = _DAT_0010dda0;
  auVar23 = _DAT_0010dd90;
  auVar22 = _DAT_0010dd80;
  if (__n != 0) {
    lVar29 = __n - 1;
    auVar32._8_4_ = (int)lVar29;
    auVar32._0_8_ = lVar29;
    auVar32._12_4_ = (int)((ulong)lVar29 >> 0x20);
    uVar30 = 0;
    do {
      auVar50._8_4_ = (int)uVar30;
      auVar50._0_8_ = uVar30;
      auVar50._12_4_ = (int)(uVar30 >> 0x20);
      auVar53 = auVar32 ^ auVar28;
      auVar58 = (auVar50 | auVar27) ^ auVar28;
      iVar52 = auVar53._0_4_;
      iVar71 = -(uint)(iVar52 < auVar58._0_4_);
      iVar55 = auVar53._4_4_;
      auVar60._4_4_ = -(uint)(iVar55 < auVar58._4_4_);
      iVar56 = auVar53._8_4_;
      iVar75 = -(uint)(iVar56 < auVar58._8_4_);
      iVar57 = auVar53._12_4_;
      auVar60._12_4_ = -(uint)(iVar57 < auVar58._12_4_);
      auVar33._4_4_ = iVar71;
      auVar33._0_4_ = iVar71;
      auVar33._8_4_ = iVar75;
      auVar33._12_4_ = iVar75;
      auVar33 = pshuflw(in_XMM1,auVar33,0xe8);
      auVar59._4_4_ = -(uint)(auVar58._4_4_ == iVar55);
      auVar59._12_4_ = -(uint)(auVar58._12_4_ == iVar57);
      auVar59._0_4_ = auVar59._4_4_;
      auVar59._8_4_ = auVar59._12_4_;
      auVar42 = pshuflw(in_XMM2,auVar59,0xe8);
      auVar60._0_4_ = auVar60._4_4_;
      auVar60._8_4_ = auVar60._12_4_;
      auVar58 = pshuflw(auVar33,auVar60,0xe8);
      auVar53._8_4_ = 0xffffffff;
      auVar53._0_8_ = 0xffffffffffffffff;
      auVar53._12_4_ = 0xffffffff;
      auVar53 = (auVar58 | auVar42 & auVar33) ^ auVar53;
      auVar53 = packssdw(auVar53,auVar53);
      uVar31 = (undefined1)__c;
      if ((auVar53 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        *(undefined1 *)((long)__s + uVar30) = uVar31;
      }
      auVar42._4_4_ = iVar71;
      auVar42._0_4_ = iVar71;
      auVar42._8_4_ = iVar75;
      auVar42._12_4_ = iVar75;
      auVar60 = auVar59 & auVar42 | auVar60;
      auVar53 = packssdw(auVar60,auVar60);
      auVar58._8_4_ = 0xffffffff;
      auVar58._0_8_ = 0xffffffffffffffff;
      auVar58._12_4_ = 0xffffffff;
      auVar53 = packssdw(auVar53 ^ auVar58,auVar53 ^ auVar58);
      auVar53 = packsswb(auVar53,auVar53);
      if ((auVar53._0_4_ >> 8 & 1) != 0) {
        *(undefined1 *)((long)__s + uVar30 + 1) = uVar31;
      }
      auVar53 = (auVar50 | auVar26) ^ auVar28;
      auVar43._0_4_ = -(uint)(iVar52 < auVar53._0_4_);
      auVar43._4_4_ = -(uint)(iVar55 < auVar53._4_4_);
      auVar43._8_4_ = -(uint)(iVar56 < auVar53._8_4_);
      auVar43._12_4_ = -(uint)(iVar57 < auVar53._12_4_);
      auVar61._4_4_ = auVar43._0_4_;
      auVar61._0_4_ = auVar43._0_4_;
      auVar61._8_4_ = auVar43._8_4_;
      auVar61._12_4_ = auVar43._8_4_;
      iVar71 = -(uint)(auVar53._4_4_ == iVar55);
      iVar75 = -(uint)(auVar53._12_4_ == iVar57);
      auVar10._4_4_ = iVar71;
      auVar10._0_4_ = iVar71;
      auVar10._8_4_ = iVar75;
      auVar10._12_4_ = iVar75;
      auVar72._4_4_ = auVar43._4_4_;
      auVar72._0_4_ = auVar43._4_4_;
      auVar72._8_4_ = auVar43._12_4_;
      auVar72._12_4_ = auVar43._12_4_;
      auVar53 = auVar10 & auVar61 | auVar72;
      auVar53 = packssdw(auVar53,auVar53);
      auVar1._8_4_ = 0xffffffff;
      auVar1._0_8_ = 0xffffffffffffffff;
      auVar1._12_4_ = 0xffffffff;
      auVar53 = packssdw(auVar53 ^ auVar1,auVar53 ^ auVar1);
      auVar53 = packsswb(auVar53,auVar53);
      if ((auVar53._0_4_ >> 0x10 & 1) != 0) {
        *(undefined1 *)((long)__s + uVar30 + 2) = uVar31;
      }
      auVar53 = pshufhw(auVar53,auVar61,0x84);
      auVar11._4_4_ = iVar71;
      auVar11._0_4_ = iVar71;
      auVar11._8_4_ = iVar75;
      auVar11._12_4_ = iVar75;
      auVar58 = pshufhw(auVar43,auVar11,0x84);
      auVar33 = pshufhw(auVar53,auVar72,0x84);
      auVar34._8_4_ = 0xffffffff;
      auVar34._0_8_ = 0xffffffffffffffff;
      auVar34._12_4_ = 0xffffffff;
      auVar34 = (auVar33 | auVar58 & auVar53) ^ auVar34;
      auVar53 = packssdw(auVar34,auVar34);
      auVar53 = packsswb(auVar53,auVar53);
      if ((auVar53._0_4_ >> 0x18 & 1) != 0) {
        *(undefined1 *)((long)__s + uVar30 + 3) = uVar31;
      }
      auVar53 = (auVar50 | auVar25) ^ auVar28;
      auVar44._0_4_ = -(uint)(iVar52 < auVar53._0_4_);
      auVar44._4_4_ = -(uint)(iVar55 < auVar53._4_4_);
      auVar44._8_4_ = -(uint)(iVar56 < auVar53._8_4_);
      auVar44._12_4_ = -(uint)(iVar57 < auVar53._12_4_);
      auVar12._4_4_ = auVar44._0_4_;
      auVar12._0_4_ = auVar44._0_4_;
      auVar12._8_4_ = auVar44._8_4_;
      auVar12._12_4_ = auVar44._8_4_;
      auVar58 = pshuflw(auVar72,auVar12,0xe8);
      auVar35._0_4_ = -(uint)(auVar53._0_4_ == iVar52);
      auVar35._4_4_ = -(uint)(auVar53._4_4_ == iVar55);
      auVar35._8_4_ = -(uint)(auVar53._8_4_ == iVar56);
      auVar35._12_4_ = -(uint)(auVar53._12_4_ == iVar57);
      auVar62._4_4_ = auVar35._4_4_;
      auVar62._0_4_ = auVar35._4_4_;
      auVar62._8_4_ = auVar35._12_4_;
      auVar62._12_4_ = auVar35._12_4_;
      auVar53 = pshuflw(auVar35,auVar62,0xe8);
      auVar63._4_4_ = auVar44._4_4_;
      auVar63._0_4_ = auVar44._4_4_;
      auVar63._8_4_ = auVar44._12_4_;
      auVar63._12_4_ = auVar44._12_4_;
      auVar33 = pshuflw(auVar44,auVar63,0xe8);
      auVar2._8_4_ = 0xffffffff;
      auVar2._0_8_ = 0xffffffffffffffff;
      auVar2._12_4_ = 0xffffffff;
      auVar53 = packssdw(auVar53 & auVar58,(auVar33 | auVar53 & auVar58) ^ auVar2);
      auVar53 = packsswb(auVar53,auVar53);
      if ((auVar53 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        *(undefined1 *)((long)__s + uVar30 + 4) = uVar31;
      }
      auVar13._4_4_ = auVar44._0_4_;
      auVar13._0_4_ = auVar44._0_4_;
      auVar13._8_4_ = auVar44._8_4_;
      auVar13._12_4_ = auVar44._8_4_;
      auVar63 = auVar62 & auVar13 | auVar63;
      auVar33 = packssdw(auVar63,auVar63);
      auVar3._8_4_ = 0xffffffff;
      auVar3._0_8_ = 0xffffffffffffffff;
      auVar3._12_4_ = 0xffffffff;
      auVar53 = packssdw(auVar53,auVar33 ^ auVar3);
      auVar53 = packsswb(auVar53,auVar53);
      if ((auVar53._4_2_ >> 8 & 1) != 0) {
        *(undefined1 *)((long)__s + uVar30 + 5) = uVar31;
      }
      auVar53 = (auVar50 | auVar24) ^ auVar28;
      auVar45._0_4_ = -(uint)(iVar52 < auVar53._0_4_);
      auVar45._4_4_ = -(uint)(iVar55 < auVar53._4_4_);
      auVar45._8_4_ = -(uint)(iVar56 < auVar53._8_4_);
      auVar45._12_4_ = -(uint)(iVar57 < auVar53._12_4_);
      auVar64._4_4_ = auVar45._0_4_;
      auVar64._0_4_ = auVar45._0_4_;
      auVar64._8_4_ = auVar45._8_4_;
      auVar64._12_4_ = auVar45._8_4_;
      iVar71 = -(uint)(auVar53._4_4_ == iVar55);
      iVar75 = -(uint)(auVar53._12_4_ == iVar57);
      auVar14._4_4_ = iVar71;
      auVar14._0_4_ = iVar71;
      auVar14._8_4_ = iVar75;
      auVar14._12_4_ = iVar75;
      auVar73._4_4_ = auVar45._4_4_;
      auVar73._0_4_ = auVar45._4_4_;
      auVar73._8_4_ = auVar45._12_4_;
      auVar73._12_4_ = auVar45._12_4_;
      auVar53 = auVar14 & auVar64 | auVar73;
      auVar53 = packssdw(auVar53,auVar53);
      auVar4._8_4_ = 0xffffffff;
      auVar4._0_8_ = 0xffffffffffffffff;
      auVar4._12_4_ = 0xffffffff;
      auVar53 = packssdw(auVar53 ^ auVar4,auVar53 ^ auVar4);
      auVar53 = packsswb(auVar53,auVar53);
      if ((auVar53 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        *(undefined1 *)((long)__s + uVar30 + 6) = uVar31;
      }
      auVar53 = pshufhw(auVar53,auVar64,0x84);
      auVar15._4_4_ = iVar71;
      auVar15._0_4_ = iVar71;
      auVar15._8_4_ = iVar75;
      auVar15._12_4_ = iVar75;
      auVar58 = pshufhw(auVar45,auVar15,0x84);
      auVar33 = pshufhw(auVar53,auVar73,0x84);
      auVar36._8_4_ = 0xffffffff;
      auVar36._0_8_ = 0xffffffffffffffff;
      auVar36._12_4_ = 0xffffffff;
      auVar36 = (auVar33 | auVar58 & auVar53) ^ auVar36;
      auVar53 = packssdw(auVar36,auVar36);
      auVar53 = packsswb(auVar53,auVar53);
      if ((auVar53._6_2_ >> 8 & 1) != 0) {
        *(undefined1 *)((long)__s + uVar30 + 7) = uVar31;
      }
      auVar53 = (auVar50 | auVar23) ^ auVar28;
      auVar46._0_4_ = -(uint)(iVar52 < auVar53._0_4_);
      auVar46._4_4_ = -(uint)(iVar55 < auVar53._4_4_);
      auVar46._8_4_ = -(uint)(iVar56 < auVar53._8_4_);
      auVar46._12_4_ = -(uint)(iVar57 < auVar53._12_4_);
      auVar16._4_4_ = auVar46._0_4_;
      auVar16._0_4_ = auVar46._0_4_;
      auVar16._8_4_ = auVar46._8_4_;
      auVar16._12_4_ = auVar46._8_4_;
      auVar58 = pshuflw(auVar73,auVar16,0xe8);
      auVar37._0_4_ = -(uint)(auVar53._0_4_ == iVar52);
      auVar37._4_4_ = -(uint)(auVar53._4_4_ == iVar55);
      auVar37._8_4_ = -(uint)(auVar53._8_4_ == iVar56);
      auVar37._12_4_ = -(uint)(auVar53._12_4_ == iVar57);
      auVar65._4_4_ = auVar37._4_4_;
      auVar65._0_4_ = auVar37._4_4_;
      auVar65._8_4_ = auVar37._12_4_;
      auVar65._12_4_ = auVar37._12_4_;
      auVar53 = pshuflw(auVar37,auVar65,0xe8);
      auVar66._4_4_ = auVar46._4_4_;
      auVar66._0_4_ = auVar46._4_4_;
      auVar66._8_4_ = auVar46._12_4_;
      auVar66._12_4_ = auVar46._12_4_;
      auVar33 = pshuflw(auVar46,auVar66,0xe8);
      auVar47._8_4_ = 0xffffffff;
      auVar47._0_8_ = 0xffffffffffffffff;
      auVar47._12_4_ = 0xffffffff;
      auVar47 = (auVar33 | auVar53 & auVar58) ^ auVar47;
      auVar33 = packssdw(auVar47,auVar47);
      auVar53 = packsswb(auVar53 & auVar58,auVar33);
      if ((auVar53 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        *(undefined1 *)((long)__s + uVar30 + 8) = uVar31;
      }
      auVar17._4_4_ = auVar46._0_4_;
      auVar17._0_4_ = auVar46._0_4_;
      auVar17._8_4_ = auVar46._8_4_;
      auVar17._12_4_ = auVar46._8_4_;
      auVar66 = auVar65 & auVar17 | auVar66;
      auVar33 = packssdw(auVar66,auVar66);
      auVar5._8_4_ = 0xffffffff;
      auVar5._0_8_ = 0xffffffffffffffff;
      auVar5._12_4_ = 0xffffffff;
      auVar33 = packssdw(auVar33 ^ auVar5,auVar33 ^ auVar5);
      auVar53 = packsswb(auVar53,auVar33);
      if ((auVar53._8_2_ >> 8 & 1) != 0) {
        *(undefined1 *)((long)__s + uVar30 + 9) = uVar31;
      }
      auVar53 = (auVar50 | auVar22) ^ auVar28;
      auVar48._0_4_ = -(uint)(iVar52 < auVar53._0_4_);
      auVar48._4_4_ = -(uint)(iVar55 < auVar53._4_4_);
      auVar48._8_4_ = -(uint)(iVar56 < auVar53._8_4_);
      auVar48._12_4_ = -(uint)(iVar57 < auVar53._12_4_);
      auVar67._4_4_ = auVar48._0_4_;
      auVar67._0_4_ = auVar48._0_4_;
      auVar67._8_4_ = auVar48._8_4_;
      auVar67._12_4_ = auVar48._8_4_;
      iVar71 = -(uint)(auVar53._4_4_ == iVar55);
      iVar75 = -(uint)(auVar53._12_4_ == iVar57);
      auVar18._4_4_ = iVar71;
      auVar18._0_4_ = iVar71;
      auVar18._8_4_ = iVar75;
      auVar18._12_4_ = iVar75;
      auVar74._4_4_ = auVar48._4_4_;
      auVar74._0_4_ = auVar48._4_4_;
      auVar74._8_4_ = auVar48._12_4_;
      auVar74._12_4_ = auVar48._12_4_;
      auVar53 = auVar18 & auVar67 | auVar74;
      auVar53 = packssdw(auVar53,auVar53);
      auVar6._8_4_ = 0xffffffff;
      auVar6._0_8_ = 0xffffffffffffffff;
      auVar6._12_4_ = 0xffffffff;
      auVar53 = packssdw(auVar53 ^ auVar6,auVar53 ^ auVar6);
      auVar53 = packsswb(auVar53,auVar53);
      if ((auVar53 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
        *(undefined1 *)((long)__s + uVar30 + 10) = uVar31;
      }
      auVar53 = pshufhw(auVar53,auVar67,0x84);
      auVar19._4_4_ = iVar71;
      auVar19._0_4_ = iVar71;
      auVar19._8_4_ = iVar75;
      auVar19._12_4_ = iVar75;
      auVar58 = pshufhw(auVar48,auVar19,0x84);
      auVar33 = pshufhw(auVar53,auVar74,0x84);
      auVar38._8_4_ = 0xffffffff;
      auVar38._0_8_ = 0xffffffffffffffff;
      auVar38._12_4_ = 0xffffffff;
      auVar38 = (auVar33 | auVar58 & auVar53) ^ auVar38;
      auVar53 = packssdw(auVar38,auVar38);
      auVar53 = packsswb(auVar53,auVar53);
      if ((auVar53._10_2_ >> 8 & 1) != 0) {
        *(undefined1 *)((long)__s + uVar30 + 0xb) = uVar31;
      }
      auVar53 = (auVar50 | _DAT_0010dd70) ^ auVar28;
      auVar49._0_4_ = -(uint)(iVar52 < auVar53._0_4_);
      auVar49._4_4_ = -(uint)(iVar55 < auVar53._4_4_);
      auVar49._8_4_ = -(uint)(iVar56 < auVar53._8_4_);
      auVar49._12_4_ = -(uint)(iVar57 < auVar53._12_4_);
      auVar20._4_4_ = auVar49._0_4_;
      auVar20._0_4_ = auVar49._0_4_;
      auVar20._8_4_ = auVar49._8_4_;
      auVar20._12_4_ = auVar49._8_4_;
      auVar58 = pshuflw(auVar74,auVar20,0xe8);
      auVar39._0_4_ = -(uint)(auVar53._0_4_ == iVar52);
      auVar39._4_4_ = -(uint)(auVar53._4_4_ == iVar55);
      auVar39._8_4_ = -(uint)(auVar53._8_4_ == iVar56);
      auVar39._12_4_ = -(uint)(auVar53._12_4_ == iVar57);
      auVar68._4_4_ = auVar39._4_4_;
      auVar68._0_4_ = auVar39._4_4_;
      auVar68._8_4_ = auVar39._12_4_;
      auVar68._12_4_ = auVar39._12_4_;
      auVar53 = pshuflw(auVar39,auVar68,0xe8);
      auVar69._4_4_ = auVar49._4_4_;
      auVar69._0_4_ = auVar49._4_4_;
      auVar69._8_4_ = auVar49._12_4_;
      auVar69._12_4_ = auVar49._12_4_;
      auVar33 = pshuflw(auVar49,auVar69,0xe8);
      auVar7._8_4_ = 0xffffffff;
      auVar7._0_8_ = 0xffffffffffffffff;
      auVar7._12_4_ = 0xffffffff;
      auVar53 = packssdw(auVar53 & auVar58,(auVar33 | auVar53 & auVar58) ^ auVar7);
      auVar53 = packsswb(auVar53,auVar53);
      if ((auVar53 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        *(undefined1 *)((long)__s + uVar30 + 0xc) = uVar31;
      }
      auVar21._4_4_ = auVar49._0_4_;
      auVar21._0_4_ = auVar49._0_4_;
      auVar21._8_4_ = auVar49._8_4_;
      auVar21._12_4_ = auVar49._8_4_;
      auVar69 = auVar68 & auVar21 | auVar69;
      auVar33 = packssdw(auVar69,auVar69);
      auVar8._8_4_ = 0xffffffff;
      auVar8._0_8_ = 0xffffffffffffffff;
      auVar8._12_4_ = 0xffffffff;
      auVar53 = packssdw(auVar53,auVar33 ^ auVar8);
      auVar53 = packsswb(auVar53,auVar53);
      if ((auVar53._12_2_ >> 8 & 1) != 0) {
        *(undefined1 *)((long)__s + uVar30 + 0xd) = uVar31;
      }
      auVar53 = (auVar50 | _DAT_0010dd60) ^ auVar28;
      auVar40._0_4_ = -(uint)(iVar52 < auVar53._0_4_);
      auVar40._4_4_ = -(uint)(iVar55 < auVar53._4_4_);
      auVar40._8_4_ = -(uint)(iVar56 < auVar53._8_4_);
      auVar40._12_4_ = -(uint)(iVar57 < auVar53._12_4_);
      auVar70._4_4_ = auVar40._0_4_;
      auVar70._0_4_ = auVar40._0_4_;
      auVar70._8_4_ = auVar40._8_4_;
      auVar70._12_4_ = auVar40._8_4_;
      auVar51._4_4_ = -(uint)(auVar53._4_4_ == iVar55);
      auVar51._12_4_ = -(uint)(auVar53._12_4_ == iVar57);
      auVar51._0_4_ = auVar51._4_4_;
      auVar51._8_4_ = auVar51._12_4_;
      auVar54._4_4_ = auVar40._4_4_;
      auVar54._0_4_ = auVar40._4_4_;
      auVar54._8_4_ = auVar40._12_4_;
      auVar54._12_4_ = auVar40._12_4_;
      auVar33 = auVar51 & auVar70 | auVar54;
      auVar53 = packssdw(auVar40,auVar33);
      auVar9._8_4_ = 0xffffffff;
      auVar9._0_8_ = 0xffffffffffffffff;
      auVar9._12_4_ = 0xffffffff;
      auVar53 = packssdw(auVar53 ^ auVar9,auVar53 ^ auVar9);
      auVar53 = packsswb(auVar53,auVar53);
      if ((auVar53 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        *(undefined1 *)((long)__s + uVar30 + 0xe) = uVar31;
      }
      auVar53 = pshufhw(auVar53,auVar70,0x84);
      auVar33 = pshufhw(auVar33,auVar51,0x84);
      in_XMM2 = auVar33 & auVar53;
      auVar53 = pshufhw(auVar53,auVar54,0x84);
      auVar41._8_4_ = 0xffffffff;
      auVar41._0_8_ = 0xffffffffffffffff;
      auVar41._12_4_ = 0xffffffff;
      auVar41 = (auVar53 | in_XMM2) ^ auVar41;
      auVar53 = packssdw(auVar41,auVar41);
      in_XMM1 = packsswb(auVar53,auVar53);
      if ((in_XMM1._14_2_ >> 8 & 1) != 0) {
        *(undefined1 *)((long)__s + uVar30 + 0xf) = uVar31;
      }
      uVar30 = uVar30 + 0x10;
    } while ((__n + 0xf & 0xfffffffffffffff0) != uVar30);
  }
  return __s;
}

Assistant:

void * memset( void * s, int c, size_t n )
{
    unsigned char * p = ( unsigned char * ) s;

    while ( n-- )
    {
        *p++ = ( unsigned char ) c;
    }

    return s;
}